

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,string_view a,FileEntry *b)

{
  ulong uVar1;
  uint uVar2;
  difference_type __diff;
  ulong uVar4;
  ulong uVar3;
  
  uVar4 = a._M_len;
  uVar1 = (b->encoded_name)._M_string_length;
  uVar3 = uVar1;
  if (uVar4 < uVar1) {
    uVar3 = uVar4;
  }
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp(a._M_str,(b->encoded_name)._M_dataplus._M_p,uVar3);
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar4 - uVar1)) {
      uVar3 = uVar4 - uVar1;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0;
    }
  }
  return (bool)((byte)(uVar3 >> 0x1f) & 1);
}

Assistant:

bool operator()(absl::string_view a, const FileEntry& b) const {
      return a < b.name(index);
    }